

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicInputICase2::Run(BasicInputICase2 *this)

{
  int *piVar1;
  uint *data;
  long lVar2;
  Vector<unsigned_int,_4> local_fc;
  Vector<int,_4> local_ec;
  Vector<int,_4> local_dc;
  Vector<unsigned_int,_4> local_cc;
  Vector<int,_4> local_bc;
  Vector<int,_4> local_ac;
  Vector<unsigned_int,_4> local_9c;
  Vector<int,_4> local_8c;
  Vector<int,_4> local_7c;
  Vector<unsigned_int,_4> local_6c;
  Vector<int,_4> local_5c;
  Vector<int,_4> local_4c;
  Vector<unsigned_int,_4> local_3c;
  Vector<int,_3> local_2c;
  Vector<int,_3> local_20;
  uint local_14;
  BasicInputICase2 *pBStack_10;
  GLuint i;
  BasicInputICase2 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttribI4i
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14 + 8,0,0,0,0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x18,(void *)0x0,0x88e4);
  tcu::Vector<int,_3>::Vector(&local_20,1,2,3);
  piVar1 = tcu::Vector<int,_3>::operator[](&local_20,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0xc,piVar1);
  tcu::Vector<int,_3>::Vector(&local_2c,4,5,6);
  piVar1 = tcu::Vector<int,_3>::operator[](&local_2c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0xc,piVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x10,(void *)0x0,0x88e4);
  tcu::Vector<unsigned_int,_4>::Vector(&local_3c,10,0x14,0x1e,0x28);
  data = tcu::Vector<unsigned_int,_4>::operator[](&local_3c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x10,data);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,3,0x1404,0);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,2,0x1404,4);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe,1,0x1405,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,2);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe,7);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xe);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo[0],0,8);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,this->m_vbo[0],0,0xc);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,this->m_vbo[1],4,0x10);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,1);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,0);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,2);
  (this->super_BasicInputIBase).instance_count = 2;
  tcu::Vector<int,_4>::Vector(&local_4c,1,2,3,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0].m_data = local_4c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0].m_data + 2) =
       local_4c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_5c,2,3,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[2].m_data = local_5c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[2].m_data + 2) =
       local_5c.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_6c,0x14,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[6].m_data = local_6c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[6].m_data + 2) =
       local_6c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_7c,4,5,6,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[8].m_data = local_7c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[8].m_data + 2) =
       local_7c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_8c,2,3,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[10].m_data = local_8c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[10].m_data + 2) =
       local_8c.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_9c,0x14,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[0xe].m_data = local_9c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[0xe].m_data + 2) =
       local_9c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_ac,1,2,3,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0x10].m_data = local_ac.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0x10].m_data + 2) =
       local_ac.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_bc,4,5,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0x12].m_data = local_bc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0x12].m_data + 2) =
       local_bc.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_cc,0x14,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[0x16].m_data = local_cc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[0x16].m_data + 2) =
       local_cc.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_dc,4,5,6,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0x18].m_data = local_dc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0x18].m_data + 2) =
       local_dc.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_ec,4,5,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0x1a].m_data = local_ec.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0x1a].m_data + 2) =
       local_ec.m_data._8_8_;
  tcu::Vector<unsigned_int,_4>::Vector(&local_fc,0x14,0,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_dataui[0x1e].m_data = local_fc.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_dataui[0x1e].m_data + 2) =
       local_fc.m_data._8_8_;
  lVar2 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(IVec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(IVec3), &IVec3(1, 2, 3)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(IVec3), &IVec3(4, 5, 6)[0]);

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(UVec4), NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(UVec4), &UVec4(10, 20, 30, 40)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribIFormat(0, 3, GL_INT, 0);
		glVertexAttribIFormat(2, 2, GL_INT, 4);
		glVertexAttribIFormat(14, 1, GL_UNSIGNED_INT, 0);
		glVertexAttribBinding(0, 2);
		glVertexAttribBinding(2, 0);
		glVertexAttribBinding(14, 7);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(14);
		glBindVertexBuffer(0, m_vbo[0], 0, 8);
		glBindVertexBuffer(2, m_vbo[0], 0, 12);
		glBindVertexBuffer(7, m_vbo[1], 4, 16);
		glVertexBindingDivisor(0, 1);
		glVertexBindingDivisor(2, 0);
		glVertexBindingDivisor(7, 2);

		instance_count		= 2;
		expected_datai[0]   = IVec4(1, 2, 3, 1);
		expected_datai[2]   = IVec4(2, 3, 0, 1);
		expected_dataui[6]  = UVec4(20, 0, 0, 1);
		expected_datai[8]   = IVec4(4, 5, 6, 1);
		expected_datai[10]  = IVec4(2, 3, 0, 1);
		expected_dataui[14] = UVec4(20, 0, 0, 1);

		expected_datai[16]  = IVec4(1, 2, 3, 1);
		expected_datai[18]  = IVec4(4, 5, 0, 1);
		expected_dataui[22] = UVec4(20, 0, 0, 1);
		expected_datai[24]  = IVec4(4, 5, 6, 1);
		expected_datai[26]  = IVec4(4, 5, 0, 1);
		expected_dataui[30] = UVec4(20, 0, 0, 1);
		return BasicInputIBase::Run();
	}